

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixMutex_Unlock(PaUnixMutex *self)

{
  int iVar1;
  pthread_t __thread1;
  long errorCode;
  pthread_mutex_t *in_RDI;
  PaError result;
  PaHostApiTypeId hostApiType;
  
  hostApiType = paInDevelopment;
  paUtilErr_ = pthread_mutex_unlock(in_RDI);
  if (paUtilErr_ != 0) {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar1 != 0) {
      errorCode = (long)paUtilErr_;
      strerror(paUtilErr_);
      PaUtil_SetLastHostErrorInfo(hostApiType,errorCode,(char *)0x113017);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 541\n"
                     );
    hostApiType = 0xffffd8f1;
  }
  return hostApiType;
}

Assistant:

PaError PaUnixMutex_Unlock( PaUnixMutex* self )
{
    PaError result = paNoError;

    PA_ENSURE_SYSTEM( pthread_mutex_unlock( &self->mtx ), 0 );
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, &oldState ), 0 );
#endif

error:
    return result;
}